

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

char ** event_get_supported_methods(void)

{
  eventop **ppeVar1;
  int local_28;
  int local_24;
  int k;
  int i;
  char **tmp;
  eventop **method;
  
  local_24 = 0;
  for (tmp = (char **)eventops; *tmp != (char *)0x0; tmp = tmp + 1) {
    local_24 = local_24 + 1;
  }
  method = (eventop **)event_mm_calloc_((long)(local_24 + 1),8);
  if (method == (eventop **)0x0) {
    method = (eventop **)0x0;
    ppeVar1 = (eventop **)event_get_supported_methods::methods;
  }
  else {
    local_24 = 0;
    for (local_28 = 0; eventops[local_28] != (eventop *)0x0; local_28 = local_28 + 1) {
      method[local_24] = (eventop *)eventops[local_28]->name;
      local_24 = local_24 + 1;
    }
    method[local_24] = (eventop *)0x0;
    ppeVar1 = method;
    if (event_get_supported_methods::methods != (char **)0x0) {
      event_mm_free_(event_get_supported_methods::methods);
    }
  }
  event_get_supported_methods::methods = (char **)ppeVar1;
  return (char **)method;
}

Assistant:

const char **
event_get_supported_methods(void)
{
	static const char **methods = NULL;
	const struct eventop **method;
	const char **tmp;
	int i = 0, k;

	/* count all methods */
	for (method = &eventops[0]; *method != NULL; ++method) {
		++i;
	}

	/* allocate one more than we need for the NULL pointer */
	tmp = mm_calloc((i + 1), sizeof(char *));
	if (tmp == NULL)
		return (NULL);

	/* populate the array with the supported methods */
	for (k = 0, i = 0; eventops[k] != NULL; ++k) {
		tmp[i++] = eventops[k]->name;
	}
	tmp[i] = NULL;

	if (methods != NULL)
		mm_free((char**)methods);

	methods = tmp;

	return (methods);
}